

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmAndRgEa<(moira::Instr)59,(moira::Mode)5,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  ushort in_CX;
  StrWriter *in_RSI;
  long in_RDI;
  Ea<(moira::Mode)5,_(moira::Size)1> dst;
  Dn src;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  u16 in_stack_ffffffffffffffce;
  Moira *in_stack_ffffffffffffffd0;
  Ea<(moira::Mode)5,_(moira::Size)1> *in_stack_ffffffffffffffd8;
  Dn in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  
  Dn::Dn((Dn *)&stack0xffffffffffffffe0,(int)(uint)in_CX >> 9 & 7);
  Op<(moira::Mode)5,(moira::Size)1>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce,
             (u32 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  pSVar1 = StrWriter::operator<<(in_RSI);
  pSVar1 = StrWriter::operator<<(pSVar1);
  pSVar1 = StrWriter::operator<<(pSVar1,(Align)*(int *)(in_RDI + 0x14));
  pSVar1 = StrWriter::operator<<(pSVar1,in_stack_ffffffffffffffe0);
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<
            ((StrWriter *)
             CONCAT26(in_CX,CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0.raw)),
             in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void
Moira::dasmAndRgEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Dn       ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}